

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  byte *pbVar1;
  bool bVar2;
  string *psVar3;
  int64 iVar4;
  uint first_byte_or_zero;
  
  if (*p == (string *)&fixed_address_empty_string_abi_cxx11_) {
    psVar3 = (string *)operator_new(0x20);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    psVar3->_M_string_length = 0;
    (psVar3->field_2)._M_local_buf[0] = '\0';
    *p = psVar3;
  }
  psVar3 = *p;
  pbVar1 = input->buffer_;
  if (pbVar1 < input->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar1;
    if (-1 < (char)*pbVar1) {
      input->buffer_ = pbVar1 + 1;
      bVar2 = true;
      goto LAB_0028c3c4;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar4;
  bVar2 = -1 < iVar4;
LAB_0028c3c4:
  if (bVar2) {
    bVar2 = io::CodedInputStream::ReadString(input,psVar3,first_byte_or_zero);
    return bVar2;
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, std::string** p) {
  if (*p == &GetEmptyStringAlreadyInited()) {
    *p = new std::string();
  }
  return ReadBytesToString(input, *p);
}